

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeStringSlice(TranslateToFuzzReader *this)

{
  Expression *ref;
  Expression *start;
  Expression *end;
  StringSliceWTF *pSVar1;
  
  ref = makeTrappingRefUse(this,(HeapType)0x50);
  start = make(this,(Type)0x2);
  end = make(this,(Type)0x2);
  pSVar1 = Builder::makeStringSliceWTF(&this->builder,ref,start,end);
  return (Expression *)pSVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringSlice() {
  auto* ref = makeTrappingRefUse(HeapType::string);
  auto* start = make(Type::i32);
  auto* end = make(Type::i32);
  return builder.makeStringSliceWTF(ref, start, end);
}